

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sumStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  SumCtx *p;
  i64 iVar2;
  double r;
  i64 x;
  
  p = (SumCtx *)sqlite3_aggregate_context(context,0x28);
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (iVar1 == 5 || p == (SumCtx *)0x0) {
    return;
  }
  p->cnt = p->cnt + 1;
  if (p->approx == '\0') {
    if (iVar1 == 1) {
      x = p->iSum;
      iVar2 = sqlite3VdbeIntValue(*argv);
      iVar1 = sqlite3AddInt64(&x,iVar2);
      if (iVar1 != 0) {
        p->ovrfl = '\x01';
        kahanBabuskaNeumaierInit(p,p->iSum);
        p->approx = '\x01';
        iVar2 = sqlite3VdbeIntValue(*argv);
        kahanBabuskaNeumaierStepInt64(p,iVar2);
        return;
      }
      p->iSum = x;
      return;
    }
    kahanBabuskaNeumaierInit(p,p->iSum);
    p->approx = '\x01';
  }
  else {
    if (iVar1 == 1) {
      iVar2 = sqlite3VdbeIntValue(*argv);
      kahanBabuskaNeumaierStepInt64(p,iVar2);
      return;
    }
    p->ovrfl = '\0';
  }
  r = sqlite3VdbeRealValue(*argv);
  kahanBabuskaNeumaierStep(p,r);
  return;
}

Assistant:

static void sumStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  if( p && type!=SQLITE_NULL ){
    p->cnt++;
    if( p->approx==0 ){
      if( type!=SQLITE_INTEGER ){
        kahanBabuskaNeumaierInit(p, p->iSum);
        p->approx = 1;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }else{
        i64 x = p->iSum;
        if( sqlite3AddInt64(&x, sqlite3_value_int64(argv[0]))==0 ){
          p->iSum = x;
        }else{
          p->ovrfl = 1;
          kahanBabuskaNeumaierInit(p, p->iSum);
          p->approx = 1;
          kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
        }
      }
    }else{
      if( type==SQLITE_INTEGER ){
        kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
      }else{
        p->ovrfl = 0;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }
    }
  }
}